

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O2

double one_res_en_loodis_all_list
                 (Structure *Conf,Residue *res,vector<int,_std::allocator<int>_> *List)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Atom *pAVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  Residue *pRVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  double local_80;
  
  iVar10 = (int)res->_posn;
  uVar12 = (ulong)((long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar14 = 0;
  uVar9 = (ulong)*(uint *)&res->_numAtom;
  if ((short)*(uint *)&res->_numAtom < 1) {
    uVar9 = uVar14;
  }
  uVar13 = uVar12 & 0xffffffff;
  if ((int)uVar12 < 1) {
    uVar13 = uVar14;
  }
  local_80 = 0.0;
  do {
    if (uVar14 == uVar13) {
      return local_80;
    }
    iVar2 = (List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar14];
    if (iVar10 + 2 <= iVar2 || iVar2 <= iVar10 + -2) {
      pRVar11 = Conf->_res;
      if (((((iVar2 == iVar10 || pRVar11[iVar2]._center.super_Point.x != 0.0) &&
            (res->_atom[1]._type != -0x3039)) && ((pRVar11[iVar2]._atom)->_type != -0x3039)) &&
          ((dVar16 = res->_atom[1].super_Point.x, dVar16 != 0.0 || (NAN(dVar16))))) &&
         ((dVar16 = ((pRVar11[iVar2]._atom)->super_Point).x, dVar16 != 0.0 || (NAN(dVar16))))) {
        uVar1 = pRVar11[iVar2]._numAtom;
        dVar16 = Point::dis(&(res->_center).super_Point,&pRVar11[iVar2]._center.super_Point);
        if (dVar16 < 12.0) {
          uVar7 = 0;
          if (0 < (short)uVar1) {
            uVar7 = uVar1;
          }
          for (uVar12 = 0; uVar12 != (uVar9 & 0xffff); uVar12 = uVar12 + 1) {
            uVar8 = VdwUtils::should_ignore_atom(res->_atom + uVar12);
            if (uVar8 == 0) {
              for (lVar15 = 0; (ulong)uVar7 * 0x50 != lVar15; lVar15 = lVar15 + 0x50) {
                uVar8 = VdwUtils::should_ignore_atom
                                  ((Atom *)((long)&((Conf->_res[iVar2]._atom)->super_Point).x +
                                           lVar15));
                if (uVar8 == 0) {
                  iVar3 = res->_atom[uVar12]._type;
                  pAVar6 = Conf->_res[iVar2]._atom;
                  iVar4 = *(int *)((long)&pAVar6->_type + lVar15);
                  dVar16 = Point::dis(&res->_atom[uVar12].super_Point,
                                      (Point *)((long)&(pAVar6->super_Point).x + lVar15));
                  if (dVar16 < 8.0) {
                    if ((res->_type == 1) && (Conf->_res[iVar2]._type == 1)) {
                      pRVar11 = Conf->_res + iVar2;
                      iVar5 = res->_atom[uVar12]._type;
                      if (iVar5 == 4) {
                        if (((dVar16 < 3.3) && (2.7 < dVar16)) &&
                           (*(int *)((long)&pRVar11->_atom->_type + lVar15) == 0x10)) {
LAB_00125e1f:
                          local_80 = local_80 + -2.0;
                          goto LAB_00125df3;
                        }
                      }
                      else if (iVar5 == 0x10) {
                        iVar5 = *(int *)((long)&pRVar11->_atom->_type + lVar15);
                        if (((dVar16 < 2.2) && (1.8 < dVar16)) && (iVar5 == 0x10)) {
                          local_80 = local_80 + -2.5;
                          goto LAB_00125df3;
                        }
                        if (((iVar5 == 4) && (2.7 < dVar16)) && (dVar16 < 3.3)) goto LAB_00125e1f;
                      }
                      local_80 = local_80 +
                                 *(double *)
                                  ((long)iVar3 * 0x3200 + (long)iVar4 * 0x280 + 0x158670 +
                                  (long)(int)(dVar16 / 0.1) * 8);
                    }
                    else {
                      local_80 = local_80 + PF::LOODIS[iVar3 + -1][iVar4 + -1][(int)(dVar16 / 0.1)];
                    }
                  }
                }
LAB_00125df3:
              }
            }
          }
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

double one_res_en_loodis_all_list(const Structure &Conf, const Residue &res, const std::vector<int> &List) {
    int i, j, k, p, disInd, numatom2;
    double dis;
    double energy = 0;
    int atomIndex1, atomIndex2;

    // get the position of res to check for adjacent residues
    // @TODO - verify this is initialized properly
    const int position = res._posn;

    const int numatom1 = res._numAtom;

    const int List_size = static_cast<int>(List.size());

    for (p = 0; p < List_size; p++) {
        i = List[p];

        // exclude neighbor residue
        if (i < position + 2 && i > position - 2)
            continue;

        // exclude residues with x center at 0 -> uninitialized?
        // @TODO - verify this
        if (Conf._res[i]._center.x == 0) {
            if (i != position)
                continue;
        }

        // skip past uninitialized residues and atom positions
        if (res._atom[1]._type == UNDEF || Conf._res[i]._atom[0]._type == UNDEF || res._atom[1].x == 0. ||
            Conf._res[i]._atom[0].x == 0.)
            continue;

        numatom2 = Conf._res[i]._numAtom;

        if (res._center.dis(Conf._res[i]._center) < CC_DIS_CUT) {
            for (j = 0; j < numatom1; ++j) {
                if (VdwUtils::should_ignore_atom(res._atom[j])) { continue; }
                for (k = 0; k < numatom2; ++k) {
                    if (VdwUtils::should_ignore_atom(Conf._res[i]._atom[k])) { continue; }
                    atomIndex1 = res._atom[j]._type;
                    atomIndex2 = Conf._res[i]._atom[k]._type;
                    dis = res._atom[j].dis(Conf._res[i]._atom[k]);
                    if (dis < (H_INLO * LOODIS_DIS_BIN)) {
                        disInd = (int) (dis / H_INLO);
                        if (res._type == 1 && Conf._res[i]._type == 1) {
                            if ((res._atom[j]._type == 16) && (Conf._res[i]._atom[k]._type == 16) &&
                                (dis > 1.8 && dis < 2.2)) {
                                energy += -2.5;
                            }
                            else if (((res._atom[j]._type == 16 && Conf._res[i]._atom[k]._type == 4) ||
                                      (res._atom[j]._type == 4 && Conf._res[i]._atom[k]._type == 16)) &&
                                     (dis > 2.7 && dis < 3.3)) {
                                energy += -2;
                            }
                            else
                                energy += PF::LOODIS[atomIndex1 - 1][atomIndex2 - 1][disInd];
                        }
                        else
                            energy += PF::LOODIS[atomIndex1 - 1][atomIndex2 - 1][disInd];
                    }
                }
            }
        }
    }

    return energy;
}